

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::callPassThrough
          (TestMembraneImpl *this,CallPassThroughContext context)

{
  TransformPromiseNodeBase *this_00;
  size_t in_RCX;
  CallContextHook *in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  int in_R8D;
  Promise<void> PVar1;
  CallPassThroughContext context_local;
  Own<kj::_::PromiseNode> local_f0;
  undefined1 local_e0 [56];
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  req;
  Reader params;
  Own<kj::_::PromiseNode> local_40;
  Maybe<capnp::MessageSize> local_30;
  
  context_local.hook = in_RDX;
  CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  ::getParams(&params,&context_local);
  capnproto_test::capnp::test::TestMembrane::CallPassThroughParams::Reader::getThing
            ((Client *)local_e0,&params);
  local_30.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Thing::Client::passThroughRequest
            (&req,(Client *)local_e0,&local_30);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_e0 + 8));
  if ((params._reader.dataSize == 0) || ((*params._reader.data & 1) == 0)) {
    Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
    ::send((Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
            *)local_e0,(int)&req,__buf,in_RCX,in_R8D);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)local_e0,
               kj::_::
               TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:68:11),_kj::_::PropagateException>
               ::anon_class_8_1_bc11688f_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00659a78;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)context_local.hook;
    local_f0.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,capnp::_::(anonymous_namespace)::TestMembraneImpl::callPassThrough(capnp::CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>)::{lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>&&)#1},kj::_::PropagateException>>
          ::instance;
    local_40.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,capnp::_::(anonymous_namespace)::TestMembraneImpl::callPassThrough(capnp::CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>)::{lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>&&)#1},kj::_::PropagateException>>
          ::instance;
    local_f0.ptr = (PromiseNode *)0x0;
    (this->super_Server)._vptr_Server =
         (_func_int **)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,capnp::_::(anonymous_namespace)::TestMembraneImpl::callPassThrough(capnp::CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>)::{lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>&&)#1},kj::_::PropagateException>>
          ::instance;
    *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
    local_40.ptr = (PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode>::dispose(&local_40);
    kj::Own<kj::_::PromiseNode>::dispose(&local_f0);
    RemotePromise<capnproto_test::capnp::test::TestMembrane::Result>::~RemotePromise
              ((RemotePromise<capnproto_test::capnp::test::TestMembrane::Result> *)local_e0);
  }
  else {
    (*(context_local.hook)->_vptr_CallContextHook[3])(this,context_local.hook,&req.hook);
  }
  kj::Own<capnp::RequestHook>::dispose(&req.hook);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> callPassThrough(CallPassThroughContext context) override {
    auto params = context.getParams();
    auto req = params.getThing().passThroughRequest();
    if (params.getTailCall()) {
      return context.tailCall(kj::mv(req));
    } else {
      return req.send().then(
          [KJ_CPCAP(context)](Response<test::TestMembrane::Result>&& result) mutable {
        context.setResults(result);
      });
    }